

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileParser::ObjFileParser
          (ObjFileParser *this,IOStreamBuffer<char> *streamBuffer,string *modelName,IOSystem *io,
          ProgressHandler *progress,string *originalObjFileName)

{
  IOSystem *pIVar1;
  Model *this_00;
  pointer pMVar2;
  Material *pMVar3;
  mapped_type *ppMVar4;
  int local_48 [4];
  string *local_38;
  string *originalObjFileName_local;
  ProgressHandler *progress_local;
  IOSystem *io_local;
  string *modelName_local;
  IOStreamBuffer<char> *streamBuffer_local;
  ObjFileParser *this_local;
  
  local_38 = originalObjFileName;
  originalObjFileName_local = (string *)progress;
  progress_local = (ProgressHandler *)io;
  io_local = (IOSystem *)modelName;
  modelName_local = (string *)streamBuffer;
  streamBuffer_local = (IOStreamBuffer<char> *)this;
  __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::__normal_iterator
            (&this->m_DataIt);
  __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::__normal_iterator
            (&this->m_DataItEnd);
  std::unique_ptr<Assimp::ObjFile::Model,std::default_delete<Assimp::ObjFile::Model>>::
  unique_ptr<std::default_delete<Assimp::ObjFile::Model>,void>
            ((unique_ptr<Assimp::ObjFile::Model,std::default_delete<Assimp::ObjFile::Model>> *)
             &this->m_pModel,(nullptr_t)0x0);
  this->m_uiLine = 0;
  this->m_pIO = (IOSystem *)progress_local;
  this->m_progress = (ProgressHandler *)originalObjFileName_local;
  std::__cxx11::string::string((string *)&this->m_originalObjFileName,(string *)local_38);
  local_48[0] = 0;
  std::fill_n<char*,unsigned_long,int>(this->m_buffer,0x1000,local_48);
  this_00 = (Model *)operator_new(0x178);
  ObjFile::Model::Model(this_00);
  std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::reset
            (&this->m_pModel,this_00);
  pIVar1 = io_local;
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  std::__cxx11::string::operator=((string *)pMVar2,(string *)pIVar1);
  pMVar3 = (Material *)operator_new(0x409c);
  ObjFile::Material::Material(pMVar3);
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  pMVar2->m_pDefaultMaterial = pMVar3;
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  aiString::Set(&pMVar2->m_pDefaultMaterial->MaterialName,(string *)DEFAULT_MATERIAL_abi_cxx11_);
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pMVar2->m_MaterialLib,(value_type *)DEFAULT_MATERIAL_abi_cxx11_);
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  pMVar3 = pMVar2->m_pDefaultMaterial;
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  ppMVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
            ::operator[](&pMVar2->m_MaterialMap,(key_type *)DEFAULT_MATERIAL_abi_cxx11_);
  *ppMVar4 = pMVar3;
  parseFile(this,(IOStreamBuffer<char> *)modelName_local);
  return;
}

Assistant:

ObjFileParser::ObjFileParser( IOStreamBuffer<char> &streamBuffer, const std::string &modelName,
                              IOSystem *io, ProgressHandler* progress,
                              const std::string &originalObjFileName) :
    m_DataIt(),
    m_DataItEnd(),
    m_pModel(nullptr),
    m_uiLine(0),
    m_pIO( io ),
    m_progress(progress),
    m_originalObjFileName(originalObjFileName)
{
    std::fill_n(m_buffer,Buffersize,0);

    // Create the model instance to store all the data
    m_pModel.reset(new ObjFile::Model());
    m_pModel->m_ModelName = modelName;

    // create default material and store it
    m_pModel->m_pDefaultMaterial = new ObjFile::Material;
    m_pModel->m_pDefaultMaterial->MaterialName.Set( DEFAULT_MATERIAL );
    m_pModel->m_MaterialLib.push_back( DEFAULT_MATERIAL );
    m_pModel->m_MaterialMap[ DEFAULT_MATERIAL ] = m_pModel->m_pDefaultMaterial;

    // Start parsing the file
    parseFile( streamBuffer );
}